

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::vertexInfeasible
          (HighsCliqueTable *this,HighsDomain *globaldom,HighsInt col,HighsInt val)

{
  bool bVar1;
  bool bVar2;
  int in_ECX;
  undefined4 in_EDX;
  HighsDomain *in_RSI;
  HighsDomain *in_RDI;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *this_00;
  Reason unaff_retaddr;
  bool wasfixed;
  HighsDomain *in_stack_000000e8;
  HighsCliqueTable *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffffc8;
  HighsInt in_stack_ffffffffffffffcc;
  HighsDomain *in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  HighsDomain *this_01;
  HighsDomain *this_02;
  
  this_02 = in_RDI;
  bVar1 = HighsDomain::isFixed(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  this_00 = (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
            (double)(1 - in_ECX);
  uVar3 = in_EDX;
  this_01 = in_RSI;
  HighsDomain::Reason::unspecified();
  HighsDomain::fixCol(this_02,(HighsInt)((ulong)this_01 >> 0x20),(double)CONCAT44(uVar3,in_ECX),
                      unaff_retaddr);
  bVar2 = HighsDomain::infeasible(this_01);
  if (!bVar2) {
    if (!bVar1) {
      *(int *)&(in_RDI->objProp_).partitionCliqueData.
               super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
               ._M_impl.super__Vector_impl_data._M_finish =
           *(int *)&(in_RDI->objProp_).partitionCliqueData.
                    super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
    emplace_back<int&,int&>(this_00,(int *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8),(int *)in_RSI)
    ;
    processInfeasibleVertices(in_stack_000000f0,in_stack_000000e8);
  }
  return;
}

Assistant:

void HighsCliqueTable::vertexInfeasible(HighsDomain& globaldom, HighsInt col,
                                        HighsInt val) {
  bool wasfixed = globaldom.isFixed(col);
  globaldom.fixCol(col, double(1 - val));
  if (globaldom.infeasible()) return;
  if (!wasfixed) ++nfixings;
  infeasvertexstack.emplace_back(col, val);
  processInfeasibleVertices(globaldom);
}